

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

bool deqp::gls::BuiltinPrecisionTests::inputLess<tcu::Vector<float,2>>
               (Vector<float,_2> *val1,Vector<float,_2> *val2)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte in_DL;
  byte bVar6;
  long lVar7;
  
  lVar7 = 0;
  bVar4 = true;
  do {
    while( true ) {
      bVar3 = bVar4;
      fVar1 = val1->m_data[lVar7];
      fVar2 = val2->m_data[lVar7];
      if (!NAN(fVar1)) {
        bVar5 = true;
        if (NAN(fVar2)) {
          bVar6 = 1;
          goto LAB_00689d57;
        }
        in_DL = 1;
        bVar6 = 1;
        if (fVar1 < fVar2) goto LAB_00689d57;
      }
      if (NAN(fVar2)) break;
      bVar5 = fVar2 < fVar1;
      in_DL = 0;
      bVar6 = in_DL;
      if (bVar5) goto LAB_00689d57;
      lVar7 = 1;
      bVar6 = 0;
      bVar4 = false;
      if (!bVar3) goto LAB_00689d57;
    }
    lVar7 = 1;
    bVar5 = false;
    bVar6 = in_DL;
    bVar4 = false;
  } while (bVar3);
LAB_00689d57:
  return (bool)(bVar5 & bVar6);
}

Assistant:

bool inputLess (const T& val1, const T& val2)
{
	return InputLess<T>()(val1, val2);
}